

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

int Cba_NtkFindMissing(Vec_Int_t *vObjs,int nObjs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  void *__s;
  long lVar6;
  ulong uVar7;
  
  uVar1 = nObjs + 1;
  uVar5 = 0x10;
  if (0xe < (uint)nObjs) {
    uVar5 = uVar1;
  }
  if (uVar5 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar5 << 2);
  }
  memset(__s,0xff,(long)(int)uVar1 << 2);
  iVar2 = vObjs->nSize;
  if (0 < (long)iVar2) {
    piVar4 = vObjs->pArray;
    lVar6 = 0;
    do {
      iVar3 = piVar4[lVar6];
      if (((long)iVar3 < 0) || (nObjs < iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(int *)((long)__s + (long)iVar3 * 4) = (int)lVar6;
      lVar6 = lVar6 + 1;
    } while (iVar2 != lVar6);
  }
  if (nObjs < 1) {
    uVar7 = 0xffffffff;
    if (__s == (void *)0x0) {
      return -1;
    }
  }
  else {
    uVar7 = 1;
    do {
      if (*(int *)((long)__s + uVar7 * 4) == -1) goto LAB_00334d5f;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    uVar7 = 0xffffffff;
  }
LAB_00334d5f:
  free(__s);
  return (int)uVar7;
}

Assistant:

int Cba_NtkFindMissing( Vec_Int_t * vObjs, int nObjs )
{
    Vec_Int_t * vMap = Vec_IntStartFull( nObjs + 1 );
    int i, iObj;
    Vec_IntForEachEntry( vObjs, iObj, i )
        Vec_IntWriteEntry( vMap, iObj, i );
    Vec_IntForEachEntryStart( vMap, i, iObj, 1 )
        if ( i == -1 )
        {
            Vec_IntFree( vMap );
            return iObj;
        }
    Vec_IntFree( vMap );
    return -1;
}